

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack1to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128i _sh00_3;
  __m128i _sl00_3;
  __m128i _w0123_1;
  __m128i _val_1;
  int j_2;
  __m128i _tmp3_2;
  __m128i _tmp2_2;
  __m128i _tmp1_2;
  __m128i _tmp0_2;
  __m128i _sh01_1;
  __m128i _sl01_1;
  __m128i _sh00_2;
  __m128i _sl00_2;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw01_1;
  __m128i _w01_1;
  __m128i _val0_1;
  __m128i _val01_1;
  int j_3;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn1_1;
  int nn4_1;
  char *kptr0_1;
  char *tmpptr_3;
  __m128i _sh00_1;
  __m128i _sl00_1;
  __m128i _w0123;
  __m128i _val;
  int j;
  __m128i _tmp3_1;
  __m128i _tmp2_1;
  __m128i _tmp1_1;
  __m128i _tmp0_1;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh11;
  __m128i _sl11;
  __m128i _sh10;
  __m128i _sl10;
  __m128i _sh01;
  __m128i _sl01;
  __m128i _sh00;
  __m128i _sl00;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw01;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _val01;
  int j_1;
  __m128i _sum13;
  __m128i _sum12;
  __m128i _sum11;
  __m128i _sum03;
  __m128i _sum02;
  __m128i _sum01;
  __m128i _sum10;
  __m128i _sum00;
  int nn1;
  int nn4;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr0;
  int p;
  int k_3;
  char *img0_3;
  int k_2;
  char *img3_1;
  char *img2_1;
  char *img1_1;
  char *img0_2;
  int q_1;
  char *tmpptr_1;
  int i_1;
  int k_1;
  char *img0_1;
  int k;
  char *img3;
  char *img2;
  char *img1;
  char *img0;
  int q;
  char *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_15;
  Mat *m_13;
  Mat *m_12;
  Mat *m_6;
  Mat *m;
  Mat *m_16;
  Mat *m_14;
  Mat *m_11;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Option *in_stack_ffffffffffffda78;
  Mat *in_stack_ffffffffffffda80;
  Mat *in_stack_ffffffffffffda88;
  void **ppvVar17;
  undefined4 in_stack_ffffffffffffda90;
  undefined2 in_stack_ffffffffffffda94;
  undefined2 in_stack_ffffffffffffda96;
  size_t in_stack_ffffffffffffda98;
  undefined8 in_stack_ffffffffffffdaa0;
  int _c;
  int in_stack_ffffffffffffdaa8;
  int in_stack_ffffffffffffdaac;
  Mat *in_stack_ffffffffffffdab0;
  Allocator *in_stack_ffffffffffffdb10;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  int local_223c;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2178;
  undefined8 uStack_2170;
  int local_214c;
  undefined1 local_2148 [16];
  undefined1 local_2138 [16];
  undefined1 local_2128 [16];
  undefined1 local_2118 [16];
  undefined8 local_20f8;
  undefined8 local_20f0;
  undefined8 local_20e8;
  undefined4 local_20e0;
  long local_20d8;
  undefined4 local_20d0;
  undefined4 local_20cc;
  undefined4 local_20c8;
  undefined4 local_20c4;
  undefined4 local_20c0;
  undefined8 local_20b8;
  undefined1 (*local_20b0) [16];
  undefined8 local_20a8;
  undefined8 local_20a0;
  undefined8 local_2098;
  undefined4 local_2090;
  long *local_2088;
  undefined4 local_2080;
  undefined4 local_207c;
  undefined4 local_2078;
  undefined4 local_2074;
  undefined4 local_2070;
  undefined8 local_2068;
  ulong *local_2060;
  undefined1 local_2058 [16];
  undefined1 local_2048 [16];
  undefined1 local_2038 [16];
  undefined8 local_2028;
  undefined8 uStack_2020;
  int local_200c;
  undefined1 local_2008 [16];
  undefined1 local_1ff8 [16];
  undefined1 local_1fe8 [16];
  undefined1 local_1fd8 [16];
  undefined1 local_1fc8 [16];
  undefined1 local_1fb8 [16];
  undefined1 local_1fa8 [16];
  undefined1 local_1f98 [16];
  undefined1 local_1f88 [16];
  undefined1 local_1f78 [16];
  undefined1 local_1f68 [16];
  undefined1 local_1f58 [16];
  undefined1 local_1f48 [16];
  undefined1 local_1f38 [16];
  undefined1 local_1f28 [16];
  undefined1 local_1f18 [16];
  undefined1 local_1f08 [16];
  undefined1 local_1ef8 [16];
  undefined1 local_1ee8 [16];
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined1 local_1ec8 [16];
  undefined1 local_1eb8 [16];
  undefined1 local_1ea8 [16];
  int local_1e8c;
  undefined1 local_1e88 [16];
  undefined1 local_1e78 [16];
  undefined1 local_1e68 [16];
  undefined1 local_1e58 [16];
  undefined1 local_1e48 [16];
  undefined1 local_1e38 [16];
  undefined1 local_1e28 [16];
  undefined1 local_1e18 [16];
  int local_1e00;
  int local_1dfc;
  undefined8 local_1df8;
  undefined8 local_1df0;
  undefined8 local_1de8;
  undefined4 local_1de0;
  long local_1dd8;
  undefined4 local_1dd0;
  undefined4 local_1dcc;
  undefined4 local_1dc8;
  undefined4 local_1dc4;
  undefined4 local_1dc0;
  undefined8 local_1db8;
  undefined1 (*local_1db0) [16];
  undefined8 local_1da8;
  undefined8 local_1da0;
  undefined8 local_1d98;
  undefined4 local_1d90;
  long *local_1d88;
  undefined4 local_1d80;
  undefined4 local_1d7c;
  undefined4 local_1d78;
  undefined4 local_1d74;
  undefined4 local_1d70;
  undefined8 local_1d68;
  ulong *local_1d60;
  int local_1d54;
  undefined8 local_1d50;
  undefined8 local_1d48;
  undefined8 local_1d40;
  undefined4 local_1d38;
  long local_1d30;
  undefined4 local_1d28;
  undefined4 local_1d24;
  undefined4 local_1d20;
  undefined4 local_1d1c;
  undefined4 local_1d18;
  undefined8 local_1d10;
  undefined8 *local_1d08;
  int local_1d00;
  int local_1cfc;
  undefined8 local_1cf8;
  undefined8 local_1cf0;
  undefined8 local_1ce8;
  undefined4 local_1ce0;
  long local_1cd8;
  undefined4 local_1cd0;
  undefined4 local_1ccc;
  undefined4 local_1cc8;
  undefined4 local_1cc4;
  undefined4 local_1cc0;
  undefined8 local_1cb8;
  undefined1 *local_1cb0;
  int local_1ca4;
  undefined8 local_1ca0;
  undefined8 local_1c98;
  undefined8 local_1c90;
  undefined4 local_1c88;
  long local_1c80;
  undefined4 local_1c78;
  undefined4 local_1c74;
  undefined4 local_1c70;
  undefined4 local_1c6c;
  undefined4 local_1c68;
  undefined8 local_1c60;
  undefined1 *local_1c58;
  undefined8 local_1c50;
  undefined8 local_1c48;
  undefined8 local_1c40;
  undefined4 local_1c38;
  long local_1c30;
  undefined4 local_1c28;
  undefined4 local_1c24;
  undefined4 local_1c20;
  undefined4 local_1c1c;
  undefined4 local_1c18;
  undefined8 local_1c10;
  undefined1 *local_1c08;
  undefined8 local_1c00;
  undefined8 local_1bf8;
  undefined8 local_1bf0;
  undefined4 local_1be8;
  long local_1be0;
  undefined4 local_1bd8;
  undefined4 local_1bd4;
  undefined4 local_1bd0;
  undefined4 local_1bcc;
  undefined4 local_1bc8;
  undefined8 local_1bc0;
  undefined1 *local_1bb8;
  undefined8 local_1bb0;
  undefined8 local_1ba8;
  undefined8 local_1ba0;
  undefined4 local_1b98;
  long local_1b90;
  undefined4 local_1b88;
  undefined4 local_1b84;
  undefined4 local_1b80;
  undefined4 local_1b7c;
  undefined4 local_1b78;
  undefined8 local_1b70;
  undefined1 *local_1b68;
  int local_1b5c;
  undefined8 local_1b58;
  undefined8 local_1b50;
  undefined8 local_1b48;
  undefined4 local_1b40;
  long *local_1b38;
  undefined4 local_1b30;
  undefined4 local_1b2c;
  undefined4 local_1b28;
  undefined4 local_1b24;
  undefined4 local_1b20;
  undefined8 local_1b18;
  undefined1 *local_1b10;
  int local_1b08;
  int local_1b04;
  undefined8 local_1b00;
  undefined8 local_1af8;
  undefined8 local_1af0;
  undefined4 local_1ae8;
  long local_1ae0;
  undefined4 local_1ad8;
  undefined4 local_1ad4;
  undefined4 local_1ad0;
  undefined4 local_1acc;
  undefined4 local_1ac8;
  undefined8 local_1ac0;
  undefined1 *local_1ab8;
  int local_1aac;
  undefined8 local_1aa8;
  undefined8 local_1aa0;
  undefined8 local_1a98;
  undefined4 local_1a90;
  long local_1a88;
  undefined4 local_1a80;
  undefined4 local_1a7c;
  undefined4 local_1a78;
  undefined4 local_1a74;
  undefined4 local_1a70;
  undefined8 local_1a68;
  undefined1 *local_1a60;
  undefined8 local_1a58;
  undefined8 local_1a50;
  undefined8 local_1a48;
  undefined4 local_1a40;
  long local_1a38;
  undefined4 local_1a30;
  undefined4 local_1a2c;
  undefined4 local_1a28;
  undefined4 local_1a24;
  undefined4 local_1a20;
  undefined8 local_1a18;
  undefined1 *local_1a10;
  undefined8 local_1a08;
  undefined8 local_1a00;
  undefined8 local_19f8;
  undefined4 local_19f0;
  long local_19e8;
  undefined4 local_19e0;
  undefined4 local_19dc;
  undefined4 local_19d8;
  undefined4 local_19d4;
  undefined4 local_19d0;
  undefined8 local_19c8;
  undefined1 *local_19c0;
  undefined8 local_19b8;
  undefined8 local_19b0;
  undefined8 local_19a8;
  undefined4 local_19a0;
  long local_1998;
  undefined4 local_1990;
  undefined4 local_198c;
  undefined4 local_1988;
  undefined4 local_1984;
  undefined4 local_1980;
  undefined8 local_1978;
  undefined1 *local_1970;
  int local_1964;
  undefined8 local_1960;
  undefined8 local_1958;
  undefined8 local_1950;
  undefined4 local_1948;
  long *local_1940;
  undefined4 local_1938;
  undefined4 local_1934;
  undefined4 local_1930;
  undefined4 local_192c;
  undefined4 local_1928;
  undefined8 local_1920;
  undefined1 *local_1918;
  int local_190c;
  int local_1908;
  int local_1904;
  int local_1900;
  void *local_18f0;
  int *local_18e8;
  long local_18e0;
  undefined4 local_18d8;
  long *local_18d0;
  undefined4 local_18c8;
  int local_18c4;
  int local_18c0;
  undefined4 local_18bc;
  undefined4 local_18b8;
  long local_18b0;
  int local_18a8;
  int local_18a4;
  int local_18a0;
  int local_189c;
  long *local_1890;
  long *local_1888;
  long *local_1880;
  void **local_1878;
  undefined8 *local_1870;
  undefined8 *local_1868;
  undefined8 *local_1860;
  undefined8 *local_1858;
  undefined8 *local_1850;
  undefined8 *local_1848;
  undefined8 *local_1840;
  undefined8 *local_1838;
  undefined8 *local_1830;
  undefined8 *local_1828;
  undefined8 *local_1820;
  undefined8 *local_1818;
  undefined8 *local_1810;
  undefined8 *local_1808;
  undefined8 *local_1800;
  undefined8 *local_17f8;
  undefined8 *local_17f0;
  void **local_17e8;
  int local_17c8;
  undefined4 local_17c4;
  void **local_17c0;
  undefined8 *local_17b0;
  undefined8 *local_17a0;
  undefined8 *local_1790;
  undefined8 *local_1780;
  undefined8 *local_1770;
  undefined8 *local_1760;
  undefined8 *local_1750;
  undefined8 *local_1740;
  undefined8 *local_1730;
  undefined8 *local_1720;
  undefined8 *local_1710;
  undefined8 *local_1700;
  undefined8 *local_16f0;
  undefined8 *local_16e0;
  undefined8 *local_16d0;
  undefined8 *local_16c0;
  undefined8 *local_16b0;
  undefined1 local_16a5;
  int local_16a4;
  void **local_16a0;
  undefined8 *local_1698;
  undefined1 local_1675;
  int local_1674;
  void **local_1670;
  undefined8 *local_1668;
  undefined1 local_1645;
  int local_1644;
  undefined8 *local_1638;
  undefined1 local_1615;
  int local_1614;
  void **local_1610;
  undefined8 *local_1608;
  undefined1 local_15e5;
  int local_15e4;
  void **local_15e0;
  undefined8 *local_15d8;
  undefined1 local_15b5;
  int local_15b4;
  undefined8 *local_15a8;
  undefined1 local_1585;
  int local_1584;
  undefined8 *local_1578;
  undefined1 local_1555;
  int local_1554;
  undefined8 *local_1548;
  undefined1 local_1525;
  int local_1524;
  undefined8 *local_1518;
  undefined1 local_14f5;
  int local_14f4;
  undefined8 *local_14e8;
  undefined1 local_14c5;
  int local_14c4;
  undefined8 *local_14b8;
  undefined1 local_1495;
  int local_1494;
  undefined8 *local_1488;
  undefined1 local_1465;
  int local_1464;
  undefined8 *local_1458;
  undefined1 local_1435;
  int local_1434;
  undefined8 *local_1428;
  undefined1 local_1405;
  int local_1404;
  undefined8 *local_13f8;
  undefined1 local_13d5;
  int local_13d4;
  undefined8 *local_13c8;
  undefined1 local_13a5;
  int local_13a4;
  undefined8 *local_1398;
  void *local_1268;
  undefined1 local_1258 [16];
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined1 local_11d8 [16];
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined1 local_11b8 [16];
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined1 local_1198 [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined1 local_1178 [16];
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined1 local_1158 [16];
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined1 local_1058 [16];
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined1 local_1038 [16];
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined1 local_ff8 [16];
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined1 local_fd8 [16];
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined1 local_f78 [16];
  undefined8 local_f68;
  undefined8 uStack_f60;
  long local_f50;
  undefined4 local_f44;
  long local_f40;
  long local_f38;
  undefined4 local_f2c;
  int local_f28;
  int local_f24;
  undefined8 *local_f20;
  long local_f18;
  undefined4 local_f0c;
  long local_f08;
  long local_f00;
  undefined4 local_ef4;
  int local_ef0;
  int local_eec;
  undefined8 *local_ee8;
  long local_ee0;
  undefined4 local_ed4;
  long local_ed0;
  long local_ec8;
  undefined4 local_ebc;
  int local_eb8;
  int local_eb4;
  undefined8 *local_eb0;
  long local_ea8;
  undefined4 local_e9c;
  long local_e98;
  long local_e90;
  undefined4 local_e84;
  int local_e80;
  int local_e7c;
  undefined8 *local_e78;
  long local_e70;
  undefined4 local_e64;
  long local_e60;
  long local_e58;
  undefined4 local_e4c;
  int local_e48;
  int local_e44;
  undefined8 *local_e40;
  long local_e38;
  undefined4 local_e2c;
  long local_e28;
  long local_e20;
  undefined4 local_e14;
  int local_e10;
  int local_e0c;
  undefined8 *local_e08;
  long local_e00;
  undefined4 local_df4;
  long local_df0;
  long local_de8;
  undefined4 local_ddc;
  int local_dd8;
  int local_dd4;
  undefined8 *local_dd0;
  long local_dc8;
  undefined4 local_dbc;
  long local_db8;
  long local_db0;
  undefined4 local_da4;
  int local_da0;
  int local_d9c;
  undefined8 *local_d98;
  long local_d90;
  undefined4 local_d84;
  long local_d80;
  long local_d78;
  undefined4 local_d6c;
  int local_d68;
  int local_d64;
  undefined8 *local_d60;
  long local_d58;
  undefined4 local_d4c;
  long local_d48;
  long local_d40;
  undefined4 local_d34;
  int local_d30;
  int local_d2c;
  undefined8 *local_d28;
  long local_d20;
  undefined4 local_d14;
  long local_d10;
  undefined1 (*local_d08) [16];
  undefined4 local_cfc;
  int local_cf8;
  int local_cf4;
  undefined8 *local_cf0;
  long local_ce8;
  undefined4 local_cdc;
  long local_cd8;
  undefined1 (*local_cd0) [16];
  undefined4 local_cc4;
  int local_cc0;
  int local_cbc;
  undefined8 *local_cb8;
  long *local_cb0;
  undefined4 local_ca4;
  long local_ca0;
  undefined1 *local_c98;
  undefined4 local_c8c;
  int local_c88;
  int local_c84;
  undefined8 *local_c80;
  long *local_c78;
  undefined4 local_c6c;
  long local_c68;
  undefined1 *local_c60;
  undefined4 local_c54;
  int local_c50;
  int local_c4c;
  undefined8 *local_c48;
  long local_c40;
  undefined4 local_c34;
  long local_c30;
  undefined8 *local_c28;
  undefined4 local_c1c;
  int local_c18;
  int local_c14;
  undefined8 *local_c10;
  long *local_c08;
  undefined4 local_bfc;
  long local_bf8;
  ulong *local_bf0;
  undefined4 local_be4;
  int local_be0;
  int local_bdc;
  undefined8 *local_bd8;
  long *local_bd0;
  undefined4 local_bc4;
  long local_bc0;
  ulong *local_bb8;
  undefined4 local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 *local_ba0;
  undefined4 local_b94;
  long local_b90;
  undefined4 local_b84;
  long local_b80;
  undefined4 local_b74;
  long local_b70;
  undefined4 local_b64;
  long local_b60;
  undefined4 local_b54;
  long local_b50;
  undefined4 local_b44;
  long local_b40;
  undefined4 local_b34;
  long local_b30;
  undefined4 local_b24;
  long local_b20;
  undefined4 local_b14;
  long local_b10;
  undefined4 local_b04;
  long local_b00;
  undefined4 local_af4;
  long local_af0;
  undefined4 local_ae4;
  long local_ae0;
  undefined4 local_ad4;
  long local_ad0;
  undefined4 local_ac4;
  long local_ac0;
  undefined4 local_ab4;
  long local_ab0;
  undefined4 local_aa4;
  long local_aa0;
  undefined4 local_a94;
  long local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined8 *local_a70;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 *local_a48;
  undefined8 *local_a40;
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined8 *local_a28;
  undefined8 *local_a20;
  undefined1 (*local_a18) [16];
  undefined1 (*local_a10) [16];
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 *local_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 *local_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined8 local_958;
  undefined8 uStack_950;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  ulong uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  ulong uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  undefined8 uStack_110;
  undefined1 (*local_100) [16];
  ulong local_f8;
  undefined8 uStack_f0;
  ulong *local_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  undefined1 (*local_c0) [16];
  ulong local_b8;
  undefined8 uStack_b0;
  ulong *local_a0;
  ulong local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  ushort local_4a;
  undefined1 local_48 [16];
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  ushort local_30;
  ushort local_2e;
  ushort local_2c;
  ushort local_2a;
  undefined1 local_28 [16];
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  _c = (int)((ulong)in_stack_ffffffffffffdaa0 >> 0x20);
  local_1890 = in_RDX;
  local_1888 = in_RSI;
  local_1880 = in_RDI;
  iVar16 = cpu_support_x86_avx2();
  if (iVar16 == 0) {
    iVar16 = cpu_support_x86_xop();
    if (iVar16 == 0) {
      local_189c = *(int *)((long)local_1880 + 0x2c);
      local_18a0 = (int)local_1880[6];
      local_18a4 = (int)local_1880[7];
      local_18a8 = (int)local_1888[7];
      local_1878 = &local_18f0;
      local_18f0 = (void *)0x0;
      local_18e8 = (int *)0x0;
      local_18e0 = 0;
      local_18d8 = 0;
      local_18d0 = (long *)0x0;
      local_18c8 = 0;
      local_18c4 = 0;
      local_18c0 = 0;
      local_18bc = 0;
      local_18b8 = 0;
      local_18b0 = 0;
      if (local_18a4 < 4) {
        if (local_189c < 2) {
          Mat::create(in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8,
                      _c,in_stack_ffffffffffffda98,
                      CONCAT22(in_stack_ffffffffffffda96,in_stack_ffffffffffffda94),
                      in_stack_ffffffffffffdb10);
        }
        else {
          Mat::create(in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8,
                      _c,in_stack_ffffffffffffda98,
                      CONCAT22(in_stack_ffffffffffffda96,in_stack_ffffffffffffda94),
                      in_stack_ffffffffffffdb10);
        }
      }
      else if (local_189c < 2) {
        Mat::create(in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8,_c
                    ,in_stack_ffffffffffffda98,
                    CONCAT22(in_stack_ffffffffffffda96,in_stack_ffffffffffffda94),
                    in_stack_ffffffffffffdb10);
      }
      else {
        Mat::create(in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8,_c
                    ,in_stack_ffffffffffffda98,
                    CONCAT22(in_stack_ffffffffffffda96,in_stack_ffffffffffffda94),
                    in_stack_ffffffffffffdb10);
      }
      local_1904 = local_189c >> 1;
      for (local_1908 = 0; local_1908 < local_1904; local_1908 = local_1908 + 1) {
        local_190c = local_1908 * 2;
        local_15e4 = local_190c / 2;
        local_15d8 = &local_1960;
        local_15e0 = &local_18f0;
        local_c98 = (undefined1 *)((long)local_18f0 + local_18b0 * local_15e4 * local_18e0);
        local_c80 = &local_1960;
        local_b50 = (long)local_18c4 * (long)local_18c0 * local_18e0;
        local_a80 = &local_1960;
        local_1870 = &local_1960;
        local_1940 = local_18d0;
        local_b54 = 0x10;
        local_c84 = local_18c4;
        local_c88 = local_18c0;
        local_c8c = local_18bc;
        local_ca0 = local_18e0;
        local_ca4 = local_18d8;
        local_cb0 = local_18d0;
        local_15e5 = 1;
        local_1960 = 0;
        local_1950 = 0;
        local_1948 = 0;
        local_1938 = 0;
        local_1934 = 0;
        local_1930 = 0;
        local_192c = 0;
        local_1928 = 0;
        local_1920 = 0;
        local_1958 = 0;
        local_1918 = local_c98;
        for (local_1964 = 0; local_1964 + 3 < local_18a4; local_1964 = local_1964 + 4) {
          local_1398 = &local_19b8;
          local_f24 = *(int *)((long)local_1880 + 0x2c);
          local_f28 = (int)local_1880[6];
          local_f2c = *(undefined4 *)((long)local_1880 + 0x34);
          local_f38 = *local_1880 + local_1880[8] * (long)local_1964 * local_1880[2];
          local_f40 = local_1880[2];
          local_f44 = (undefined4)local_1880[3];
          local_f50 = local_1880[4];
          local_f20 = &local_19b8;
          local_a90 = (long)local_f24 * (long)local_f28 * local_f40;
          local_a20 = &local_19b8;
          local_1970 = (undefined1 *)(local_f38 + local_190c);
          local_1868 = &local_19b8;
          local_13d4 = local_1964 + 1;
          local_13c8 = &local_1a08;
          local_eec = *(int *)((long)local_1880 + 0x2c);
          local_ef0 = (int)local_1880[6];
          local_ef4 = *(undefined4 *)((long)local_1880 + 0x34);
          local_f00 = *local_1880 + local_1880[8] * (long)local_13d4 * local_1880[2];
          local_f08 = local_1880[2];
          local_f0c = (undefined4)local_1880[3];
          local_f18 = local_1880[4];
          local_ee8 = &local_1a08;
          local_aa0 = (long)local_eec * (long)local_ef0 * local_f08;
          local_a28 = &local_1a08;
          local_19c0 = (undefined1 *)(local_f00 + local_190c);
          local_1860 = &local_1a08;
          local_1404 = local_1964 + 2;
          local_13f8 = &local_1a58;
          local_eb4 = *(int *)((long)local_1880 + 0x2c);
          local_eb8 = (int)local_1880[6];
          local_ebc = *(undefined4 *)((long)local_1880 + 0x34);
          local_ec8 = *local_1880 + local_1880[8] * (long)local_1404 * local_1880[2];
          local_ed0 = local_1880[2];
          local_ed4 = (undefined4)local_1880[3];
          local_ee0 = local_1880[4];
          local_eb0 = &local_1a58;
          local_ab0 = (long)local_eb4 * (long)local_eb8 * local_ed0;
          local_a30 = &local_1a58;
          local_1a10 = (undefined1 *)(local_ec8 + local_190c);
          local_1858 = &local_1a58;
          local_1434 = local_1964 + 3;
          local_1428 = &local_1aa8;
          local_e7c = *(int *)((long)local_1880 + 0x2c);
          local_e80 = (int)local_1880[6];
          local_e84 = *(undefined4 *)((long)local_1880 + 0x34);
          local_e90 = *local_1880 + local_1880[8] * (long)local_1434 * local_1880[2];
          local_e98 = local_1880[2];
          local_e9c = (undefined4)local_1880[3];
          local_ea8 = local_1880[4];
          local_e78 = &local_1aa8;
          local_ac0 = (long)local_e7c * (long)local_e80 * local_e98;
          local_a38 = &local_1aa8;
          local_1a60 = (undefined1 *)(local_e90 + local_190c);
          local_1850 = &local_1aa8;
          local_1980 = 0;
          local_1984 = 0;
          local_1988 = 0;
          local_198c = 0;
          local_19a0 = 0;
          local_19a8 = 0;
          local_19b0 = 0;
          local_19b8 = 0;
          local_19d0 = 0;
          local_19d4 = 0;
          local_19d8 = 0;
          local_19dc = 0;
          local_19f0 = 0;
          local_19f8 = 0;
          local_1a00 = 0;
          local_1a08 = 0;
          local_1a20 = 0;
          local_1a24 = 0;
          local_1a28 = 0;
          local_1a2c = 0;
          local_1a40 = 0;
          local_1a48 = 0;
          local_1a50 = 0;
          local_1a58 = 0;
          local_a94 = 0x10;
          local_aa4 = 0x10;
          local_ab4 = 0x10;
          local_ac4 = 0x10;
          local_13a4 = local_1964;
          local_13a5 = 1;
          local_13d5 = 1;
          local_1405 = 1;
          local_1435 = 1;
          local_1978 = 0;
          local_1990 = 0;
          local_19c8 = 0;
          local_19e0 = 0;
          local_1a18 = 0;
          local_1a30 = 0;
          local_1aa8 = 0;
          local_1a98 = 0;
          local_1a90 = 0;
          local_1a80 = 0;
          local_1a7c = 0;
          local_1a78 = 0;
          local_1a74 = 0;
          local_1a70 = 0;
          local_1a68 = 0;
          local_1aa0 = 0;
          for (local_1aac = 0; local_1aac < local_18a0; local_1aac = local_1aac + 1) {
            *local_1918 = *local_1970;
            local_1918[1] = *local_19c0;
            local_1918[2] = *local_1a10;
            local_1918[3] = *local_1a60;
            local_1918[4] = local_1970[1];
            local_1918[5] = local_19c0[1];
            local_1918[6] = local_1a10[1];
            local_1918[7] = local_1a60[1];
            local_1918 = local_1918 + 8;
            local_1970 = local_1970 + local_189c;
            local_19c0 = local_19c0 + local_189c;
            local_1a10 = local_1a10 + local_189c;
            local_1a60 = local_1a60 + local_189c;
          }
          local_16f0 = local_1850;
          local_16e0 = local_1858;
          local_16d0 = local_1860;
          local_16c0 = local_1868;
          local_1a88 = local_ea8;
          local_1a38 = local_ee0;
          local_19e8 = local_f18;
          local_1998 = local_f50;
        }
        for (; local_1964 < local_18a4; local_1964 = local_1964 + 1) {
          local_1458 = &local_1b00;
          local_e44 = *(int *)((long)local_1880 + 0x2c);
          local_e48 = (int)local_1880[6];
          local_e4c = *(undefined4 *)((long)local_1880 + 0x34);
          local_e58 = *local_1880 + local_1880[8] * (long)local_1964 * local_1880[2];
          local_e60 = local_1880[2];
          local_e64 = (undefined4)local_1880[3];
          local_e70 = local_1880[4];
          local_e40 = &local_1b00;
          local_ad0 = (long)local_e44 * (long)local_e48 * local_e60;
          local_ad4 = 0x10;
          local_1464 = local_1964;
          local_1465 = 1;
          local_a40 = &local_1b00;
          local_1ab8 = (undefined1 *)(local_e58 + local_190c);
          local_1848 = &local_1b00;
          local_1b00 = 0;
          local_1af0 = 0;
          local_1ae8 = 0;
          local_1ad8 = 0;
          local_1ad4 = 0;
          local_1ad0 = 0;
          local_1acc = 0;
          local_1ac8 = 0;
          local_1ac0 = 0;
          local_1af8 = 0;
          for (local_1b04 = 0; local_1b04 < local_18a0; local_1b04 = local_1b04 + 1) {
            *local_1918 = *local_1ab8;
            local_1918[1] = local_1ab8[1];
            local_1918 = local_1918 + 2;
            local_1ab8 = local_1ab8 + local_189c;
          }
          local_1700 = local_1848;
          local_1ae0 = local_e70;
        }
        local_16b0 = local_1870;
      }
      local_1900 = local_1904 * 2;
      for (local_1b08 = local_1900; local_1b08 < local_189c; local_1b08 = local_1b08 + 1) {
        local_1614 = local_1b08 / 2 + local_1b08 % 2;
        local_1608 = &local_1b58;
        local_1610 = &local_18f0;
        local_c60 = (undefined1 *)((long)local_18f0 + local_18b0 * local_1614 * local_18e0);
        local_c48 = &local_1b58;
        local_b60 = (long)local_18c4 * (long)local_18c0 * local_18e0;
        local_a88 = &local_1b58;
        local_1840 = &local_1b58;
        local_1b38 = local_18d0;
        local_b64 = 0x10;
        local_c4c = local_18c4;
        local_c50 = local_18c0;
        local_c54 = local_18bc;
        local_c68 = local_18e0;
        local_c6c = local_18d8;
        local_c78 = local_18d0;
        local_1615 = 1;
        local_1b58 = 0;
        local_1b48 = 0;
        local_1b40 = 0;
        local_1b30 = 0;
        local_1b2c = 0;
        local_1b28 = 0;
        local_1b24 = 0;
        local_1b20 = 0;
        local_1b18 = 0;
        local_1b50 = 0;
        local_1b10 = local_c60;
        for (local_1b5c = 0; local_1b5c + 3 < local_18a4; local_1b5c = local_1b5c + 4) {
          local_1488 = &local_1bb0;
          local_e0c = *(int *)((long)local_1880 + 0x2c);
          local_e10 = (int)local_1880[6];
          local_e14 = *(undefined4 *)((long)local_1880 + 0x34);
          local_e20 = *local_1880 + local_1880[8] * (long)local_1b5c * local_1880[2];
          local_e28 = local_1880[2];
          local_e2c = (undefined4)local_1880[3];
          local_e38 = local_1880[4];
          local_e08 = &local_1bb0;
          local_ae0 = (long)local_e0c * (long)local_e10 * local_e28;
          local_a48 = &local_1bb0;
          local_1b68 = (undefined1 *)(local_e20 + local_1b08);
          local_1838 = &local_1bb0;
          local_14c4 = local_1b5c + 1;
          local_14b8 = &local_1c00;
          local_dd4 = *(int *)((long)local_1880 + 0x2c);
          local_dd8 = (int)local_1880[6];
          local_ddc = *(undefined4 *)((long)local_1880 + 0x34);
          local_de8 = *local_1880 + local_1880[8] * (long)local_14c4 * local_1880[2];
          local_df0 = local_1880[2];
          local_df4 = (undefined4)local_1880[3];
          local_e00 = local_1880[4];
          local_dd0 = &local_1c00;
          local_af0 = (long)local_dd4 * (long)local_dd8 * local_df0;
          local_a50 = &local_1c00;
          local_1bb8 = (undefined1 *)(local_de8 + local_1b08);
          local_1830 = &local_1c00;
          local_14f4 = local_1b5c + 2;
          local_14e8 = &local_1c50;
          local_d9c = *(int *)((long)local_1880 + 0x2c);
          local_da0 = (int)local_1880[6];
          local_da4 = *(undefined4 *)((long)local_1880 + 0x34);
          local_db0 = *local_1880 + local_1880[8] * (long)local_14f4 * local_1880[2];
          local_db8 = local_1880[2];
          local_dbc = (undefined4)local_1880[3];
          local_dc8 = local_1880[4];
          local_d98 = &local_1c50;
          local_b00 = (long)local_d9c * (long)local_da0 * local_db8;
          local_a58 = &local_1c50;
          local_1c08 = (undefined1 *)(local_db0 + local_1b08);
          local_1828 = &local_1c50;
          local_1524 = local_1b5c + 3;
          local_1518 = &local_1ca0;
          local_d64 = *(int *)((long)local_1880 + 0x2c);
          local_d68 = (int)local_1880[6];
          local_d6c = *(undefined4 *)((long)local_1880 + 0x34);
          local_d78 = *local_1880 + local_1880[8] * (long)local_1524 * local_1880[2];
          local_d80 = local_1880[2];
          local_d84 = (undefined4)local_1880[3];
          local_d90 = local_1880[4];
          local_d60 = &local_1ca0;
          local_b10 = (long)local_d64 * (long)local_d68 * local_d80;
          local_a60 = &local_1ca0;
          local_1c58 = (undefined1 *)(local_d78 + local_1b08);
          local_1820 = &local_1ca0;
          local_1b78 = 0;
          local_1b7c = 0;
          local_1b80 = 0;
          local_1b84 = 0;
          local_1b98 = 0;
          local_1ba0 = 0;
          local_1ba8 = 0;
          local_1bb0 = 0;
          local_1bc8 = 0;
          local_1bcc = 0;
          local_1bd0 = 0;
          local_1bd4 = 0;
          local_1be8 = 0;
          local_1bf0 = 0;
          local_1bf8 = 0;
          local_1c00 = 0;
          local_1c18 = 0;
          local_1c1c = 0;
          local_1c20 = 0;
          local_1c24 = 0;
          local_1c38 = 0;
          local_1c40 = 0;
          local_1c48 = 0;
          local_1c50 = 0;
          local_ae4 = 0x10;
          local_af4 = 0x10;
          local_b04 = 0x10;
          local_b14 = 0x10;
          local_1494 = local_1b5c;
          local_1495 = 1;
          local_14c5 = 1;
          local_14f5 = 1;
          local_1525 = 1;
          local_1b70 = 0;
          local_1b88 = 0;
          local_1bc0 = 0;
          local_1bd8 = 0;
          local_1c10 = 0;
          local_1c28 = 0;
          local_1ca0 = 0;
          local_1c90 = 0;
          local_1c88 = 0;
          local_1c78 = 0;
          local_1c74 = 0;
          local_1c70 = 0;
          local_1c6c = 0;
          local_1c68 = 0;
          local_1c60 = 0;
          local_1c98 = 0;
          for (local_1ca4 = 0; local_1ca4 < local_18a0; local_1ca4 = local_1ca4 + 1) {
            *local_1b10 = *local_1b68;
            local_1b10[1] = *local_1bb8;
            local_1b10[2] = *local_1c08;
            local_1b10[3] = *local_1c58;
            local_1b10 = local_1b10 + 4;
            local_1b68 = local_1b68 + local_189c;
            local_1bb8 = local_1bb8 + local_189c;
            local_1c08 = local_1c08 + local_189c;
            local_1c58 = local_1c58 + local_189c;
          }
          local_1750 = local_1820;
          local_1740 = local_1828;
          local_1730 = local_1830;
          local_1720 = local_1838;
          local_1c80 = local_d90;
          local_1c30 = local_dc8;
          local_1be0 = local_e00;
          local_1b90 = local_e38;
        }
        for (; local_1b5c < local_18a4; local_1b5c = local_1b5c + 1) {
          local_1548 = &local_1cf8;
          local_d2c = *(int *)((long)local_1880 + 0x2c);
          local_d30 = (int)local_1880[6];
          local_d34 = *(undefined4 *)((long)local_1880 + 0x34);
          local_d40 = *local_1880 + local_1880[8] * (long)local_1b5c * local_1880[2];
          local_d48 = local_1880[2];
          local_d4c = (undefined4)local_1880[3];
          local_d58 = local_1880[4];
          local_d28 = &local_1cf8;
          local_b20 = (long)local_d2c * (long)local_d30 * local_d48;
          local_b24 = 0x10;
          local_1554 = local_1b5c;
          local_1555 = 1;
          local_a68 = &local_1cf8;
          local_1cb0 = (undefined1 *)(local_d40 + local_1b08);
          local_1818 = &local_1cf8;
          local_1cf8 = 0;
          local_1ce8 = 0;
          local_1ce0 = 0;
          local_1cd0 = 0;
          local_1ccc = 0;
          local_1cc8 = 0;
          local_1cc4 = 0;
          local_1cc0 = 0;
          local_1cb8 = 0;
          local_1cf0 = 0;
          for (local_1cfc = 0; local_1cfc < local_18a0; local_1cfc = local_1cfc + 1) {
            *local_1b10 = *local_1cb0;
            local_1b10 = local_1b10 + 1;
            local_1cb0 = local_1cb0 + local_189c;
          }
          local_1760 = local_1818;
          local_1cd8 = local_d58;
        }
        local_1710 = local_1840;
      }
      for (local_1d00 = 0; local_1d00 < local_18a8; local_1d00 = local_1d00 + 1) {
        local_1638 = &local_1d50;
        local_c14 = *(int *)((long)local_1888 + 0x2c);
        local_c18 = (int)local_1888[6];
        local_c1c = *(undefined4 *)((long)local_1888 + 0x34);
        local_c28 = (undefined8 *)(*local_1888 + local_1888[8] * (long)local_1d00 * local_1888[2]);
        local_c30 = local_1888[2];
        local_c34 = (undefined4)local_1888[3];
        local_c40 = local_1888[4];
        local_c10 = &local_1d50;
        local_b70 = (long)local_c14 * (long)local_c18 * local_c30;
        local_9b0 = &local_1d50;
        local_1810 = &local_1d50;
        local_b74 = 0x10;
        local_1644 = local_1d00;
        local_1645 = 1;
        local_1d50 = 0;
        local_1d40 = 0;
        local_1d38 = 0;
        local_1d28 = 0;
        local_1d24 = 0;
        local_1d20 = 0;
        local_1d1c = 0;
        local_1d18 = 0;
        local_1d10 = 0;
        local_1d48 = 0;
        local_1d08 = local_c28;
        for (local_1d54 = 0; local_1d54 + 1 < local_189c; local_1d54 = local_1d54 + 2) {
          local_1674 = local_1d54 / 2;
          local_1668 = &local_1da8;
          local_1670 = &local_18f0;
          local_bf0 = (ulong *)((long)local_18f0 + local_18b0 * local_1674 * local_18e0);
          local_bd8 = &local_1da8;
          local_b80 = (long)local_18c4 * (long)local_18c0 * local_18e0;
          local_9a0 = &local_1da8;
          local_1808 = &local_1da8;
          local_1578 = &local_1df8;
          local_cf4 = *(int *)((long)local_1890 + 0x2c);
          local_cf8 = (int)local_1890[6];
          local_cfc = *(undefined4 *)((long)local_1890 + 0x34);
          local_d08 = (undefined1 (*) [16])
                      (*local_1890 + local_1890[8] * (long)local_1d00 * local_1890[2]);
          local_d10 = local_1890[2];
          local_d14 = (undefined4)local_1890[3];
          local_d20 = local_1890[4];
          local_cf0 = &local_1df8;
          local_b30 = (long)local_cf4 * (long)local_cf8 * local_d10;
          local_a70 = &local_1df8;
          local_1800 = &local_1df8;
          local_1d70 = 0;
          local_1d74 = 0;
          local_1d78 = 0;
          local_1d7c = 0;
          local_1d88 = local_18d0;
          local_1d90 = 0;
          local_1d98 = 0;
          local_1da0 = 0;
          local_1da8 = 0;
          local_b34 = 0x10;
          local_b84 = 0x10;
          local_bdc = local_18c4;
          local_be0 = local_18c0;
          local_be4 = local_18bc;
          local_bf8 = local_18e0;
          local_bfc = local_18d8;
          local_c08 = local_18d0;
          local_1584 = local_1d00;
          local_1585 = 1;
          local_1675 = 1;
          local_1d68 = 0;
          local_1d80 = 0;
          local_1df8 = 0;
          local_1de8 = 0;
          local_1de0 = 0;
          local_1dd0 = 0;
          local_1dcc = 0;
          local_1dc8 = 0;
          local_1dc4 = 0;
          local_1dc0 = 0;
          local_1db8 = 0;
          local_1df0 = 0;
          iVar16 = local_18a4;
          if (local_18a4 < 0) {
            iVar16 = local_18a4 + 3;
          }
          local_1dfc = (iVar16 >> 2) * local_18a0;
          local_1e00 = (local_18a4 % 4) * local_18a0;
          local_8c8 = 0;
          uStack_8c0 = 0;
          local_1e18 = ZEXT816(0);
          local_8d8 = 0;
          uStack_8d0 = 0;
          local_1e28 = ZEXT816(0);
          local_1db0 = local_d08;
          local_1d60 = local_bf0;
          if (0 < local_1dfc) {
            local_938 = ZEXT816(0) << 0x20;
            local_8e8._8_8_ = SUB168(ZEXT816(0),4);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_8e8._8_8_;
            local_1e38 = auVar6 << 0x40;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_8e8._8_8_;
            local_1e48 = auVar7 << 0x40;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_8e8._8_8_;
            local_1e58 = auVar8 << 0x40;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_8e8._8_8_;
            local_1e68 = auVar9 << 0x40;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_8e8._8_8_;
            local_1e78 = auVar5 << 0x40;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_8e8._8_8_;
            local_1e88 = auVar10 << 0x40;
            local_1e8c = 0;
            while( true ) {
              if (local_1dfc <= local_1e8c) break;
              local_a0 = local_1d60;
              local_b8 = *local_1d60;
              uStack_b0 = 0;
              uStack_60 = 0;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = local_b8;
              local_1ea8 = vpmovsxbw_avx(auVar1);
              local_1eb8 = vpshufd_avx(local_1ea8,0x44);
              local_1ec8 = vpshufd_avx(local_1ea8,0xee);
              local_a10 = local_1db0;
              local_1ed8 = *(undefined8 *)*local_1db0;
              uStack_1ed0 = *(undefined8 *)(*local_1db0 + 8);
              local_888 = 0;
              local_948._8_8_ = SUB168(ZEXT816(0),4);
              uStack_880 = local_948._8_8_;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = local_948._8_8_;
              local_1ee8 = vpcmpgtb_avx(auVar11 << 0x40,*local_1db0);
              local_858 = local_1ee8._0_8_;
              uStack_850 = local_1ee8._8_8_;
              local_1ef8 = vpunpcklbw_avx(*local_1db0,local_1ee8);
              local_818 = local_1ee8._0_8_;
              uStack_810 = local_1ee8._8_8_;
              local_1f08 = vpunpckhbw_avx(*local_1db0,local_1ee8);
              local_708 = local_1eb8._0_8_;
              uStack_700 = local_1eb8._8_8_;
              local_718 = local_1ef8._0_8_;
              uStack_710 = local_1ef8._8_8_;
              local_1f18 = vpmullw_avx(local_1eb8,local_1ef8);
              local_608 = local_1eb8._0_8_;
              uStack_600 = local_1eb8._8_8_;
              local_618 = local_1ef8._0_8_;
              uStack_610 = local_1ef8._8_8_;
              local_1f28 = vpmulhw_avx(local_1eb8,local_1ef8);
              local_728 = local_1eb8._0_8_;
              uStack_720 = local_1eb8._8_8_;
              local_738 = local_1f08._0_8_;
              uStack_730 = local_1f08._8_8_;
              local_1f38 = vpmullw_avx(local_1eb8,local_1f08);
              local_628 = local_1eb8._0_8_;
              uStack_620 = local_1eb8._8_8_;
              local_638 = local_1f08._0_8_;
              uStack_630 = local_1f08._8_8_;
              local_1f48 = vpmulhw_avx(local_1eb8,local_1f08);
              local_748 = local_1ec8._0_8_;
              uStack_740 = local_1ec8._8_8_;
              local_758 = local_1ef8._0_8_;
              uStack_750 = local_1ef8._8_8_;
              local_1f58 = vpmullw_avx(local_1ec8,local_1ef8);
              local_648 = local_1ec8._0_8_;
              uStack_640 = local_1ec8._8_8_;
              local_658 = local_1ef8._0_8_;
              uStack_650 = local_1ef8._8_8_;
              local_1f68 = vpmulhw_avx(local_1ec8,local_1ef8);
              local_768 = local_1ec8._0_8_;
              uStack_760 = local_1ec8._8_8_;
              local_778 = local_1f08._0_8_;
              uStack_770 = local_1f08._8_8_;
              local_1f78 = vpmullw_avx(local_1ec8,local_1f08);
              local_668 = local_1ec8._0_8_;
              uStack_660 = local_1ec8._8_8_;
              local_678 = local_1f08._0_8_;
              uStack_670 = local_1f08._8_8_;
              local_1f88 = vpmulhw_avx(local_1ec8,local_1f08);
              local_f68 = local_1e18._0_8_;
              uStack_f60 = local_1e18._8_8_;
              local_508 = local_1f18._0_8_;
              uStack_500 = local_1f18._8_8_;
              local_518 = local_1f28._0_8_;
              uStack_510 = local_1f28._8_8_;
              local_f78 = vpunpcklwd_avx(local_1f18,local_1f28);
              local_1e18 = vpaddd_avx(local_1e18,local_f78);
              local_f88 = local_1e38._0_8_;
              uStack_f80 = local_1e38._8_8_;
              local_428 = local_1f18._0_8_;
              uStack_420 = local_1f18._8_8_;
              local_438 = local_1f28._0_8_;
              uStack_430 = local_1f28._8_8_;
              local_f98 = vpunpckhwd_avx(local_1f18,local_1f28);
              local_1e38 = vpaddd_avx(local_1e38,local_f98);
              local_fa8 = local_1e48._0_8_;
              uStack_fa0 = local_1e48._8_8_;
              local_528 = local_1f38._0_8_;
              uStack_520 = local_1f38._8_8_;
              local_538 = local_1f48._0_8_;
              uStack_530 = local_1f48._8_8_;
              local_fb8 = vpunpcklwd_avx(local_1f38,local_1f48);
              local_1e48 = vpaddd_avx(local_1e48,local_fb8);
              local_fc8 = local_1e58._0_8_;
              uStack_fc0 = local_1e58._8_8_;
              local_448 = local_1f38._0_8_;
              uStack_440 = local_1f38._8_8_;
              local_458 = local_1f48._0_8_;
              uStack_450 = local_1f48._8_8_;
              local_fd8 = vpunpckhwd_avx(local_1f38,local_1f48);
              local_1e58 = vpaddd_avx(local_1e58,local_fd8);
              local_fe8 = local_1e28._0_8_;
              uStack_fe0 = local_1e28._8_8_;
              local_548 = local_1f58._0_8_;
              uStack_540 = local_1f58._8_8_;
              local_558 = local_1f68._0_8_;
              uStack_550 = local_1f68._8_8_;
              local_ff8 = vpunpcklwd_avx(local_1f58,local_1f68);
              local_1e28 = vpaddd_avx(local_1e28,local_ff8);
              local_1008 = local_1e68._0_8_;
              uStack_1000 = local_1e68._8_8_;
              local_468 = local_1f58._0_8_;
              uStack_460 = local_1f58._8_8_;
              local_478 = local_1f68._0_8_;
              uStack_470 = local_1f68._8_8_;
              local_1018 = vpunpckhwd_avx(local_1f58,local_1f68);
              local_1e68 = vpaddd_avx(local_1e68,local_1018);
              local_1028 = local_1e78._0_8_;
              uStack_1020 = local_1e78._8_8_;
              local_568 = local_1f78._0_8_;
              uStack_560 = local_1f78._8_8_;
              local_578 = local_1f88._0_8_;
              uStack_570 = local_1f88._8_8_;
              local_1038 = vpunpcklwd_avx(local_1f78,local_1f88);
              local_1e78 = vpaddd_avx(local_1e78,local_1038);
              local_1048 = local_1e88._0_8_;
              uStack_1040 = local_1e88._8_8_;
              local_488 = local_1f78._0_8_;
              uStack_480 = local_1f78._8_8_;
              local_498 = local_1f88._0_8_;
              uStack_490 = local_1f88._8_8_;
              local_1058 = vpunpckhwd_avx(local_1f78,local_1f88);
              local_1e88 = vpaddd_avx(local_1e88,local_1058);
              local_1d60 = local_1d60 + 1;
              local_1db0 = local_1db0 + 1;
              local_1e8c = local_1e8c + 1;
              local_948 = ZEXT816(0) << 0x20;
              local_898 = local_1ed8;
              uStack_890 = uStack_1ed0;
              local_848 = local_1ed8;
              uStack_840 = uStack_1ed0;
              local_808 = local_1ed8;
              uStack_800 = uStack_1ed0;
              local_68 = local_b8;
            }
            local_368 = local_1e18._0_8_;
            uStack_360 = local_1e18._8_8_;
            local_378 = local_1e38._0_8_;
            uStack_370 = local_1e38._8_8_;
            local_1f98 = vpunpckldq_avx(local_1e18,local_1e38);
            local_388 = local_1e48._0_8_;
            uStack_380 = local_1e48._8_8_;
            local_398 = local_1e58._0_8_;
            uStack_390 = local_1e58._8_8_;
            local_1fa8 = vpunpckldq_avx(local_1e48,local_1e58);
            local_2a8 = local_1e18._0_8_;
            uStack_2a0 = local_1e18._8_8_;
            local_2b8 = local_1e38._0_8_;
            uStack_2b0 = local_1e38._8_8_;
            local_1fb8 = vpunpckhdq_avx(local_1e18,local_1e38);
            local_2c8 = local_1e48._0_8_;
            uStack_2c0 = local_1e48._8_8_;
            local_2d8 = local_1e58._0_8_;
            uStack_2d0 = local_1e58._8_8_;
            local_1fc8 = vpunpckhdq_avx(local_1e48,local_1e58);
            local_1e8 = local_1f98._0_8_;
            uStack_1e0 = local_1f98._8_8_;
            local_1f8 = local_1fa8._0_8_;
            uStack_1f0 = local_1fa8._8_8_;
            auVar6 = vpunpcklqdq_avx(local_1f98,local_1fa8);
            local_128 = local_1f98._0_8_;
            uStack_120 = local_1f98._8_8_;
            local_138 = local_1fa8._0_8_;
            uStack_130 = local_1fa8._8_8_;
            local_1e38 = vpunpckhqdq_avx(local_1f98,local_1fa8);
            local_208 = local_1fb8._0_8_;
            uStack_200 = local_1fb8._8_8_;
            local_218 = local_1fc8._0_8_;
            uStack_210 = local_1fc8._8_8_;
            auVar7 = vpunpcklqdq_avx(local_1fb8,local_1fc8);
            local_148 = local_1fb8._0_8_;
            uStack_140 = local_1fb8._8_8_;
            local_158 = local_1fc8._0_8_;
            uStack_150 = local_1fc8._8_8_;
            local_1e58 = vpunpckhqdq_avx(local_1fb8,local_1fc8);
            local_3a8 = local_1e28._0_8_;
            uStack_3a0 = local_1e28._8_8_;
            local_3b8 = local_1e68._0_8_;
            uStack_3b0 = local_1e68._8_8_;
            local_1fd8 = vpunpckldq_avx(local_1e28,local_1e68);
            local_3c8 = local_1e78._0_8_;
            uStack_3c0 = local_1e78._8_8_;
            local_3d8 = local_1e88._0_8_;
            uStack_3d0 = local_1e88._8_8_;
            local_1fe8 = vpunpckldq_avx(local_1e78,local_1e88);
            local_2e8 = local_1e28._0_8_;
            uStack_2e0 = local_1e28._8_8_;
            local_2f8 = local_1e68._0_8_;
            uStack_2f0 = local_1e68._8_8_;
            local_1ff8 = vpunpckhdq_avx(local_1e28,local_1e68);
            local_308 = local_1e78._0_8_;
            uStack_300 = local_1e78._8_8_;
            local_318 = local_1e88._0_8_;
            uStack_310 = local_1e88._8_8_;
            local_2008 = vpunpckhdq_avx(local_1e78,local_1e88);
            local_228 = local_1fd8._0_8_;
            uStack_220 = local_1fd8._8_8_;
            local_238 = local_1fe8._0_8_;
            uStack_230 = local_1fe8._8_8_;
            auVar8 = vpunpcklqdq_avx(local_1fd8,local_1fe8);
            local_168 = local_1fd8._0_8_;
            uStack_160 = local_1fd8._8_8_;
            local_178 = local_1fe8._0_8_;
            uStack_170 = local_1fe8._8_8_;
            local_1e68 = vpunpckhqdq_avx(local_1fd8,local_1fe8);
            local_248 = local_1ff8._0_8_;
            uStack_240 = local_1ff8._8_8_;
            local_258 = local_2008._0_8_;
            uStack_250 = local_2008._8_8_;
            auVar9 = vpunpcklqdq_avx(local_1ff8,local_2008);
            local_188 = local_1ff8._0_8_;
            uStack_180 = local_1ff8._8_8_;
            local_198 = local_2008._0_8_;
            uStack_190 = local_2008._8_8_;
            local_1e88 = vpunpckhqdq_avx(local_1ff8,local_2008);
            local_1e18._0_8_ = auVar6._0_8_;
            local_1e18._8_8_ = auVar6._8_8_;
            local_1068 = local_1e18._0_8_;
            uStack_1060 = local_1e18._8_8_;
            local_1078 = local_1e38._0_8_;
            uStack_1070 = local_1e38._8_8_;
            auVar6 = vpaddd_avx(auVar6,local_1e38);
            local_1e48._0_8_ = auVar7._0_8_;
            local_1e48._8_8_ = auVar7._8_8_;
            local_1088 = local_1e48._0_8_;
            uStack_1080 = local_1e48._8_8_;
            local_1098 = local_1e58._0_8_;
            uStack_1090 = local_1e58._8_8_;
            local_1e48 = vpaddd_avx(auVar7,local_1e58);
            local_1e28._0_8_ = auVar8._0_8_;
            local_1e28._8_8_ = auVar8._8_8_;
            local_10a8 = local_1e28._0_8_;
            uStack_10a0 = local_1e28._8_8_;
            local_10b8 = local_1e68._0_8_;
            uStack_10b0 = local_1e68._8_8_;
            auVar7 = vpaddd_avx(auVar8,local_1e68);
            local_1e78._0_8_ = auVar9._0_8_;
            local_1e78._8_8_ = auVar9._8_8_;
            local_10c8 = local_1e78._0_8_;
            uStack_10c0 = local_1e78._8_8_;
            local_10d8 = local_1e88._0_8_;
            uStack_10d0 = local_1e88._8_8_;
            local_1e78 = vpaddd_avx(auVar9,local_1e88);
            local_1e18._0_8_ = auVar6._0_8_;
            local_1e18._8_8_ = auVar6._8_8_;
            local_10e8 = local_1e18._0_8_;
            uStack_10e0 = local_1e18._8_8_;
            local_10f8 = local_1e48._0_8_;
            uStack_10f0 = local_1e48._8_8_;
            local_1e18 = vpaddd_avx(auVar6,local_1e48);
            local_1e28._0_8_ = auVar7._0_8_;
            local_1e28._8_8_ = auVar7._8_8_;
            local_1108 = local_1e28._0_8_;
            uStack_1100 = local_1e28._8_8_;
            local_1118 = local_1e78._0_8_;
            uStack_1110 = local_1e78._8_8_;
            local_1e28 = vpaddd_avx(auVar7,local_1e78);
            local_928 = local_938;
            local_918 = local_938;
            local_908 = local_938;
            local_8f8 = local_938;
            local_8e8 = local_938;
          }
          local_200c = 0;
          while( true ) {
            if (local_1e00 <= local_200c) break;
            local_4 = (ushort)*(char *)((long)local_1d60 + 1);
            local_8 = (ushort)*(char *)((long)local_1d60 + 1);
            local_c = (ushort)(char)*local_1d60;
            local_10 = (ushort)(char)*local_1d60;
            auVar6 = vpinsrw_avx(ZEXT216(local_10),(uint)local_10,1);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_c,2);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_c,3);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_8,4);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_8,5);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_4,6);
            local_28 = vpinsrw_avx(auVar6,(uint)local_4,7);
            local_2028 = local_28._0_8_;
            uStack_2020 = local_28._8_8_;
            local_c0 = local_1db0;
            local_d8 = *(ulong *)*local_1db0;
            uStack_d0 = 0;
            uStack_70 = 0;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_d8;
            auVar6 = vpmovsxbw_avx(auVar2);
            local_2038 = vpshufd_avx(auVar6,0x44);
            local_788 = local_28._0_8_;
            uStack_780 = local_28._8_8_;
            local_798 = local_2038._0_8_;
            uStack_790 = local_2038._8_8_;
            local_2048 = vpmullw_avx(local_28,local_2038);
            local_688 = local_28._0_8_;
            uStack_680 = local_28._8_8_;
            local_698 = local_2038._0_8_;
            uStack_690 = local_2038._8_8_;
            local_2058 = vpmulhw_avx(local_28,local_2038);
            local_1128 = local_1e18._0_8_;
            uStack_1120 = local_1e18._8_8_;
            local_588 = local_2048._0_8_;
            uStack_580 = local_2048._8_8_;
            local_598 = local_2058._0_8_;
            uStack_590 = local_2058._8_8_;
            local_1138 = vpunpcklwd_avx(local_2048,local_2058);
            local_1e18 = vpaddd_avx(local_1e18,local_1138);
            local_1148 = local_1e28._0_8_;
            uStack_1140 = local_1e28._8_8_;
            local_4a8 = local_2048._0_8_;
            uStack_4a0 = local_2048._8_8_;
            local_4b8 = local_2058._0_8_;
            uStack_4b0 = local_2058._8_8_;
            local_1158 = vpunpckhwd_avx(local_2048,local_2058);
            local_1e28 = vpaddd_avx(local_1e28,local_1158);
            local_1d60 = (ulong *)((long)local_1d60 + 2);
            local_1db0 = (undefined1 (*) [16])(*local_1db0 + 4);
            local_200c = local_200c + 1;
            local_78 = local_d8;
            local_e = local_10;
            local_a = local_c;
            local_6 = local_8;
            local_2 = local_4;
          }
          local_9b8 = local_1d08;
          local_9c8 = local_1e18._0_8_;
          uStack_9c0 = local_1e18._8_8_;
          *local_1d08 = local_1e18._0_8_;
          local_1d08[1] = local_1e18._8_8_;
          local_9d0 = local_1d08 + 2;
          local_9e8 = local_1e28._0_8_;
          uStack_9e0 = local_1e28._8_8_;
          *local_9d0 = local_1e28._0_8_;
          local_1d08[3] = local_1e28._8_8_;
          local_1d08 = local_1d08 + 4;
          local_1790 = local_1800;
          local_1780 = local_1808;
          local_1dd8 = local_d20;
        }
        for (; local_1d54 < local_189c; local_1d54 = local_1d54 + 1) {
          local_16a4 = local_1d54 / 2 + local_1d54 % 2;
          local_1698 = &local_20a8;
          local_16a0 = &local_18f0;
          local_bb8 = (ulong *)((long)local_18f0 + local_18b0 * local_16a4 * local_18e0);
          local_ba0 = &local_20a8;
          local_b90 = (long)local_18c4 * (long)local_18c0 * local_18e0;
          local_9a8 = &local_20a8;
          local_17f8 = &local_20a8;
          local_15a8 = &local_20f8;
          local_cbc = *(int *)((long)local_1890 + 0x2c);
          local_cc0 = (int)local_1890[6];
          local_cc4 = *(undefined4 *)((long)local_1890 + 0x34);
          local_cd0 = (undefined1 (*) [16])
                      (*local_1890 + local_1890[8] * (long)local_1d00 * local_1890[2]);
          local_cd8 = local_1890[2];
          local_cdc = (undefined4)local_1890[3];
          local_ce8 = local_1890[4];
          local_cb8 = &local_20f8;
          local_b40 = (long)local_cbc * (long)local_cc0 * local_cd8;
          local_2070 = 0;
          local_2074 = 0;
          local_2078 = 0;
          local_207c = 0;
          local_2088 = local_18d0;
          local_2090 = 0;
          local_2098 = 0;
          local_20a0 = 0;
          local_20a8 = 0;
          local_b44 = 0x10;
          local_b94 = 0x10;
          local_ba4 = local_18c4;
          local_ba8 = local_18c0;
          local_bac = local_18bc;
          local_bc0 = local_18e0;
          local_bc4 = local_18d8;
          local_bd0 = local_18d0;
          local_15b4 = local_1d00;
          local_15b5 = 1;
          local_16a5 = 1;
          local_2068 = 0;
          local_2080 = 0;
          local_a78 = &local_20f8;
          local_17f0 = &local_20f8;
          local_20f8 = 0;
          local_20e8 = 0;
          local_20e0 = 0;
          local_20d0 = 0;
          local_20cc = 0;
          local_20c8 = 0;
          local_20c4 = 0;
          local_20c0 = 0;
          local_20b8 = 0;
          local_20f0 = 0;
          iVar16 = local_18a4;
          if (local_18a4 < 0) {
            iVar16 = local_18a4 + 3;
          }
          iVar16 = (iVar16 >> 2) * local_18a0;
          local_958 = 0;
          uStack_950 = 0;
          local_2118 = ZEXT816(0);
          local_20b0 = local_cd0;
          local_2060 = local_bb8;
          if (0 < iVar16) {
            local_988 = ZEXT816(0) << 0x20;
            local_968._8_8_ = SUB168(ZEXT816(0),4);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_968._8_8_;
            local_2128 = auVar12 << 0x40;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = local_968._8_8_;
            local_2138 = auVar13 << 0x40;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_968._8_8_;
            local_2148 = auVar14 << 0x40;
            local_214c = 0;
            while( true ) {
              if (iVar16 <= local_214c) break;
              local_e0 = local_2060;
              local_f8 = *local_2060;
              uStack_f0 = 0;
              uStack_80 = 0;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_f8;
              auVar6 = vpmovsxbw_avx(auVar3);
              auVar7 = vpshufd_avx(auVar6,0x44);
              local_a18 = local_20b0;
              local_8b8 = *(undefined8 *)*local_20b0;
              uStack_8b0 = *(undefined8 *)(*local_20b0 + 8);
              local_8a8 = 0;
              local_998._8_8_ = SUB168(ZEXT816(0),4);
              uStack_8a0 = local_998._8_8_;
              auVar15._8_8_ = 0;
              auVar15._0_8_ = local_998._8_8_;
              auVar6 = vpcmpgtb_avx(auVar15 << 0x40,*local_20b0);
              local_2198 = auVar6._0_8_;
              local_878 = local_2198;
              uStack_2190 = auVar6._8_8_;
              uStack_870 = uStack_2190;
              auVar9 = vpunpcklbw_avx(*local_20b0,auVar6);
              local_838 = local_2198;
              uStack_830 = uStack_2190;
              auVar5 = vpunpckhbw_avx(*local_20b0,auVar6);
              local_2178 = auVar7._0_8_;
              local_7a8 = local_2178;
              uStack_2170 = auVar7._8_8_;
              uStack_7a0 = uStack_2170;
              local_21a8 = auVar9._0_8_;
              local_7b8 = local_21a8;
              uStack_21a0 = auVar9._8_8_;
              uStack_7b0 = uStack_21a0;
              auVar8 = vpmullw_avx(auVar7,auVar9);
              local_6a8 = local_2178;
              uStack_6a0 = uStack_2170;
              local_6b8 = local_21a8;
              uStack_6b0 = uStack_21a0;
              auVar6 = vpmulhw_avx(auVar7,auVar9);
              local_7c8 = local_2178;
              uStack_7c0 = uStack_2170;
              local_21b8 = auVar5._0_8_;
              local_7d8 = local_21b8;
              uStack_21b0 = auVar5._8_8_;
              uStack_7d0 = uStack_21b0;
              auVar9 = vpmullw_avx(auVar7,auVar5);
              local_6c8 = local_2178;
              uStack_6c0 = uStack_2170;
              local_6d8 = local_21b8;
              uStack_6d0 = uStack_21b0;
              auVar7 = vpmulhw_avx(auVar7,auVar5);
              local_1168 = local_2118._0_8_;
              uStack_1160 = local_2118._8_8_;
              local_21c8 = auVar8._0_8_;
              local_5a8 = local_21c8;
              uStack_21c0 = auVar8._8_8_;
              uStack_5a0 = uStack_21c0;
              local_21d8 = auVar6._0_8_;
              local_5b8 = local_21d8;
              uStack_21d0 = auVar6._8_8_;
              uStack_5b0 = uStack_21d0;
              local_1178 = vpunpcklwd_avx(auVar8,auVar6);
              local_2118 = vpaddd_avx(local_2118,local_1178);
              local_1188 = local_2128._0_8_;
              uStack_1180 = local_2128._8_8_;
              local_4c8 = local_21c8;
              uStack_4c0 = uStack_21c0;
              local_4d8 = local_21d8;
              uStack_4d0 = uStack_21d0;
              local_1198 = vpunpckhwd_avx(auVar8,auVar6);
              local_2128 = vpaddd_avx(local_2128,local_1198);
              local_11a8 = local_2138._0_8_;
              uStack_11a0 = local_2138._8_8_;
              local_21e8 = auVar9._0_8_;
              local_5c8 = local_21e8;
              uStack_21e0 = auVar9._8_8_;
              uStack_5c0 = uStack_21e0;
              local_21f8 = auVar7._0_8_;
              local_5d8 = local_21f8;
              uStack_21f0 = auVar7._8_8_;
              uStack_5d0 = uStack_21f0;
              local_11b8 = vpunpcklwd_avx(auVar9,auVar7);
              local_2138 = vpaddd_avx(local_2138,local_11b8);
              local_11c8 = local_2148._0_8_;
              uStack_11c0 = local_2148._8_8_;
              local_4e8 = local_21e8;
              uStack_4e0 = uStack_21e0;
              local_4f8 = local_21f8;
              uStack_4f0 = uStack_21f0;
              local_11d8 = vpunpckhwd_avx(auVar9,auVar7);
              local_2148 = vpaddd_avx(local_2148,local_11d8);
              local_2060 = (ulong *)((long)local_2060 + 4);
              local_20b0 = local_20b0 + 1;
              local_214c = local_214c + 1;
              local_998 = ZEXT816(0) << 0x20;
              local_868 = local_8b8;
              uStack_860 = uStack_8b0;
              local_828 = local_8b8;
              uStack_820 = uStack_8b0;
              local_88 = local_f8;
            }
            local_3e8 = local_2118._0_8_;
            uStack_3e0 = local_2118._8_8_;
            local_3f8 = local_2128._0_8_;
            uStack_3f0 = local_2128._8_8_;
            auVar8 = vpunpckldq_avx(local_2118,local_2128);
            local_408 = local_2138._0_8_;
            uStack_400 = local_2138._8_8_;
            local_418 = local_2148._0_8_;
            uStack_410 = local_2148._8_8_;
            auVar9 = vpunpckldq_avx(local_2138,local_2148);
            local_328 = local_2118._0_8_;
            uStack_320 = local_2118._8_8_;
            local_338 = local_2128._0_8_;
            uStack_330 = local_2128._8_8_;
            auVar6 = vpunpckhdq_avx(local_2118,local_2128);
            local_348 = local_2138._0_8_;
            uStack_340 = local_2138._8_8_;
            local_358 = local_2148._0_8_;
            uStack_350 = local_2148._8_8_;
            auVar7 = vpunpckhdq_avx(local_2138,local_2148);
            local_2208 = auVar8._0_8_;
            uStack_2200 = auVar8._8_8_;
            local_2218 = auVar9._0_8_;
            uStack_2210 = auVar9._8_8_;
            local_268 = local_2208;
            uStack_260 = uStack_2200;
            local_278 = local_2218;
            uStack_270 = uStack_2210;
            auVar5 = vpunpcklqdq_avx(auVar8,auVar9);
            local_1a8 = local_2208;
            uStack_1a0 = uStack_2200;
            local_1b8 = local_2218;
            uStack_1b0 = uStack_2210;
            auVar8 = vpunpckhqdq_avx(auVar8,auVar9);
            local_2228 = auVar6._0_8_;
            uStack_2220 = auVar6._8_8_;
            local_2238 = auVar7._0_8_;
            uStack_2230 = auVar7._8_8_;
            local_288 = local_2228;
            uStack_280 = uStack_2220;
            local_298 = local_2238;
            uStack_290 = uStack_2230;
            auVar9 = vpunpcklqdq_avx(auVar6,auVar7);
            local_1c8 = local_2228;
            uStack_1c0 = uStack_2220;
            local_1d8 = local_2238;
            uStack_1d0 = uStack_2230;
            auVar7 = vpunpckhqdq_avx(auVar6,auVar7);
            local_2118._0_8_ = auVar5._0_8_;
            local_2118._8_8_ = auVar5._8_8_;
            local_2128._0_8_ = auVar8._0_8_;
            local_2128._8_8_ = auVar8._8_8_;
            local_11e8 = local_2118._0_8_;
            uStack_11e0 = local_2118._8_8_;
            local_11f8 = local_2128._0_8_;
            uStack_11f0 = local_2128._8_8_;
            auVar6 = vpaddd_avx(auVar5,auVar8);
            local_2138._0_8_ = auVar9._0_8_;
            local_2138._8_8_ = auVar9._8_8_;
            local_2148._0_8_ = auVar7._0_8_;
            local_2148._8_8_ = auVar7._8_8_;
            local_1208 = local_2138._0_8_;
            uStack_1200 = local_2138._8_8_;
            local_1218 = local_2148._0_8_;
            uStack_1210 = local_2148._8_8_;
            auVar7 = vpaddd_avx(auVar9,auVar7);
            local_2118._0_8_ = auVar6._0_8_;
            local_2118._8_8_ = auVar6._8_8_;
            local_2138._0_8_ = auVar7._0_8_;
            local_2138._8_8_ = auVar7._8_8_;
            local_1228 = local_2118._0_8_;
            uStack_1220 = local_2118._8_8_;
            local_1238 = local_2138._0_8_;
            uStack_1230 = local_2138._8_8_;
            local_2118 = vpaddd_avx(auVar6,auVar7);
            local_978 = local_988;
            local_968 = local_988;
          }
          local_223c = 0;
          while( true ) {
            if ((local_18a4 % 4) * local_18a0 <= local_223c) break;
            local_4a = (ushort)(char)*local_2060;
            auVar6 = vpinsrw_avx(ZEXT216(local_4a),(uint)local_4a,1);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_4a,2);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_4a,3);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_4a,4);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_4a,5);
            auVar6 = vpinsrw_avx(auVar6,(uint)local_4a,6);
            local_48 = vpinsrw_avx(auVar6,(uint)local_4a,7);
            local_100 = local_20b0;
            local_118 = *(ulong *)*local_20b0;
            uStack_110 = 0;
            uStack_90 = 0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_118;
            auVar6 = vpmovsxbw_avx(auVar4);
            local_7e8 = local_48._0_8_;
            uStack_7e0 = local_48._8_8_;
            local_2268 = auVar6._0_8_;
            local_7f8 = local_2268;
            uStack_2260 = auVar6._8_8_;
            uStack_7f0 = uStack_2260;
            auVar7 = vpmullw_avx(local_48,auVar6);
            local_6e8 = local_48._0_8_;
            uStack_6e0 = local_48._8_8_;
            local_6f8 = local_2268;
            uStack_6f0 = uStack_2260;
            auVar6 = vpmulhw_avx(local_48,auVar6);
            local_1248 = local_2118._0_8_;
            uStack_1240 = local_2118._8_8_;
            local_2278 = auVar7._0_8_;
            local_5e8 = local_2278;
            uStack_2270 = auVar7._8_8_;
            uStack_5e0 = uStack_2270;
            local_2288 = auVar6._0_8_;
            local_5f8 = local_2288;
            uStack_2280 = auVar6._8_8_;
            uStack_5f0 = uStack_2280;
            local_1258 = vpunpcklwd_avx(auVar7,auVar6);
            local_2118 = vpaddd_avx(local_2118,local_1258);
            local_2060 = (ulong *)((long)local_2060 + 1);
            local_20b0 = (undefined1 (*) [16])(*local_20b0 + 4);
            local_223c = local_223c + 1;
            local_98 = local_118;
            local_38 = local_4a;
            local_36 = local_4a;
            local_34 = local_4a;
            local_32 = local_4a;
            local_30 = local_4a;
            local_2e = local_4a;
            local_2c = local_4a;
            local_2a = local_4a;
          }
          local_9f0 = local_1d08;
          local_a08 = local_2118._0_8_;
          uStack_a00 = local_2118._8_8_;
          *local_1d08 = local_2118._0_8_;
          local_1d08[1] = local_2118._8_8_;
          local_1d08 = local_1d08 + 2;
          local_17b0 = local_17f0;
          local_17a0 = local_17f8;
          local_20d8 = local_ce8;
        }
        local_1770 = local_1810;
        local_1d30 = local_c40;
      }
      ppvVar17 = &local_18f0;
      if (local_18e8 != (int *)0x0) {
        local_17c4 = 0xffffffff;
        LOCK();
        local_17c8 = *local_18e8;
        *local_18e8 = *local_18e8 + -1;
        UNLOCK();
        if (local_17c8 == 1) {
          local_17e8 = ppvVar17;
          local_17c0 = ppvVar17;
          if (local_18d0 == (long *)0x0) {
            local_1268 = local_18f0;
            if (local_18f0 != (void *)0x0) {
              free(local_18f0);
            }
          }
          else {
            (**(code **)(*local_18d0 + 0x18))(local_18d0,local_18f0);
          }
        }
      }
      *ppvVar17 = (void *)0x0;
      ppvVar17[2] = (void *)0x0;
      *(undefined4 *)(ppvVar17 + 3) = 0;
      *(undefined4 *)(ppvVar17 + 5) = 0;
      *(undefined4 *)((long)ppvVar17 + 0x2c) = 0;
      *(undefined4 *)(ppvVar17 + 6) = 0;
      *(undefined4 *)((long)ppvVar17 + 0x34) = 0;
      *(undefined4 *)(ppvVar17 + 7) = 0;
      ppvVar17[8] = (void *)0x0;
      ppvVar17[1] = (void *)0x0;
    }
    else {
      im2col_sgemm_pack1to4_int8_sse_xop
                ((Mat *)CONCAT26(in_stack_ffffffffffffda96,
                                 CONCAT24(in_stack_ffffffffffffda94,in_stack_ffffffffffffda90)),
                 in_stack_ffffffffffffda88,in_stack_ffffffffffffda80,in_stack_ffffffffffffda78);
    }
  }
  else {
    im2col_sgemm_pack1to4_int8_sse_avx2
              ((Mat *)CONCAT26(in_stack_ffffffffffffda96,
                               CONCAT24(in_stack_ffffffffffffda94,in_stack_ffffffffffffda90)),
               in_stack_ffffffffffffda88,in_stack_ffffffffffffda80,in_stack_ffffffffffffda78);
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
                __m256i _sum21_33 = _mm256_setzero_si256();
                __m256i _sum31_23 = _mm256_setzero_si256();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                    __m256i _sl20_31 = _mm256_mullo_epi16(_val23_16, _w01_16);
                    __m256i _sh20_31 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                    __m256i _sl30_21 = _mm256_mullo_epi16(_val32_16, _w01_16);
                    __m256i _sh30_21 = _mm256_mulhi_epi16(_val32_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_unpacklo_epi16(_sl20_31, _sh20_31));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_unpacklo_epi16(_sl30_21, _sh30_21));
                    _sum21_33 = _mm256_add_epi32(_sum21_33, _mm256_unpackhi_epi16(_sl20_31, _sh20_31));
                    _sum31_23 = _mm256_add_epi32(_sum31_23, _mm256_unpackhi_epi16(_sl30_21, _sh30_21));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum20_32, _sum30_22);
                    _tmp1 = _mm256_unpacklo_epi32(_sum21_33, _sum31_23);
                    _tmp2 = _mm256_unpackhi_epi32(_sum20_32, _sum30_22);
                    _tmp3 = _mm256_unpackhi_epi32(_sum21_33, _sum31_23);
                    _sum20_32 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum30_22 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum21_33 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum31_23 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum30_22);
                _sum21_33 = _mm256_add_epi32(_sum21_33, _sum31_23);
                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum21_33);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
                _sum20_32 = _mm256_permutevar8x32_epi32(_sum20_32, _perm_mask);
#endif
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val01 = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);
                __m128i _val23 = _mm_set_epi16(tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[2], tmpptr[2], tmpptr[2], tmpptr[2]);

                __m128i _w0123 = _mm_set_epi16(kptr0[3], kptr0[2], kptr0[1], kptr0[0], kptr0[3], kptr0[2], kptr0[1], kptr0[0]);

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            _mm_storeu_si128((__m128i*)(outptr0 + 8), _sum20);
            _mm_storeu_si128((__m128i*)(outptr0 + 12), _sum30);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
#endif
#else
#if __XOP__
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum02 = _mm_setzero_si128();
                __m128i _sum03 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
                __m128i _sum12 = _mm_setzero_si128();
                __m128i _sum13 = _mm_setzero_si128();
#endif
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                    __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                    __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                    __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                    __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);

                    _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl01, _sh01));
                    _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                    _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl10, _sh10));
                    _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl11, _sh11));
                    _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl11, _sh11));
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
#endif
#else
#if __XOP__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                    _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                    _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                    _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                    _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                    _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                    _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                    _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                    _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum02 = _mm_add_epi32(_sum02, _sum03);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
                _sum12 = _mm_add_epi32(_sum12, _sum13);

                _sum00 = _mm_add_epi32(_sum00, _sum02);
                _sum10 = _mm_add_epi32(_sum10, _sum12);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}